

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_MainWindow.h
# Opt level: O2

void __thiscall Ui_MainWindow::setupUi(Ui_MainWindow *this,QMainWindow *MainWindow)

{
  QMainWindow *MainWindow_00;
  storage_type *psVar1;
  QAction *pQVar2;
  QWidget *pQVar3;
  QHBoxLayout *pQVar4;
  QTabWidget *this_00;
  QGroupBox *pQVar5;
  QGridLayout *pQVar6;
  QLabel *pQVar7;
  QTextBrowser *pQVar8;
  QPushButton *pQVar9;
  QVBoxLayout *this_01;
  QDoubleSpinBox *pQVar10;
  QSlider *this_02;
  QSpacerItem *pQVar11;
  TargetImageWidget *this_03;
  QComboBox *this_04;
  AllRgbWidget *this_05;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  QByteArrayView QVar23;
  QByteArrayView QVar24;
  QByteArrayView QVar25;
  QByteArrayView QVar26;
  QByteArrayView QVar27;
  QByteArrayView QVar28;
  QByteArrayView QVar29;
  QByteArrayView QVar30;
  QByteArrayView QVar31;
  QByteArrayView QVar32;
  QByteArrayView QVar33;
  QByteArrayView QVar34;
  QByteArrayView QVar35;
  QByteArrayView QVar36;
  QByteArrayView QVar37;
  QByteArrayView QVar38;
  QByteArrayView QVar39;
  QByteArrayView QVar40;
  QByteArrayView QVar41;
  QByteArrayView QVar42;
  QByteArrayView QVar43;
  QByteArrayView QVar44;
  QByteArrayView QVar45;
  QByteArrayView QVar46;
  QByteArrayView QVar47;
  QByteArrayView QVar48;
  QByteArrayView QVar49;
  QByteArrayView QVar50;
  QByteArrayView QVar51;
  QByteArrayView QVar52;
  QByteArrayView QVar53;
  QByteArrayView QVar54;
  QByteArrayView QVar55;
  QByteArrayView QVar56;
  QByteArrayView QVar57;
  QByteArrayView QVar58;
  QByteArrayView QVar59;
  QByteArrayView QVar60;
  QByteArrayView QVar61;
  QArrayDataPointer<char16_t> local_58;
  QMainWindow *local_38;
  
  QObject::objectName();
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  if (local_58.size == 0) {
    psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("MainWindow",0xb);
    QVar12.m_data = psVar1;
    QVar12.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar12);
    QObject::setObjectName((QString *)MainWindow);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  }
  QWidget::resize((QWidget *)MainWindow,0x4b2,0x318);
  pQVar2 = (QAction *)operator_new(0x10);
  QAction::QAction(pQVar2,(QObject *)MainWindow);
  this->actionNew = pQVar2;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("actionNew",10);
  QVar13.m_data = psVar1;
  QVar13.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar13);
  QObject::setObjectName((QString *)pQVar2);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  pQVar2 = (QAction *)operator_new(0x10);
  QAction::QAction(pQVar2,(QObject *)MainWindow);
  this->actionLoad = pQVar2;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("actionLoad",0xb);
  QVar14.m_data = psVar1;
  QVar14.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar14);
  QObject::setObjectName((QString *)pQVar2);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  pQVar2 = (QAction *)operator_new(0x10);
  QAction::QAction(pQVar2,(QObject *)MainWindow);
  this->actionSave = pQVar2;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("actionSave",0xb);
  QVar15.m_data = psVar1;
  QVar15.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar15);
  QObject::setObjectName((QString *)pQVar2);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  pQVar3 = (QWidget *)operator_new(0x28);
  QWidget::QWidget(pQVar3,MainWindow,0);
  this->centralwidget = pQVar3;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("centralwidget",0xe);
  QVar16.m_data = psVar1;
  QVar16.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar16);
  QObject::setObjectName((QString *)pQVar3);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  pQVar4 = (QHBoxLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout(pQVar4,this->centralwidget);
  this->horizontalLayout = pQVar4;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("horizontalLayout",0x11);
  QVar17.m_data = psVar1;
  QVar17.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar17);
  QObject::setObjectName((QString *)pQVar4);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  this_00 = (QTabWidget *)operator_new(0x28);
  QTabWidget::QTabWidget(this_00,this->centralwidget);
  this->tabWidget = this_00;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("tabWidget",10);
  QVar18.m_data = psVar1;
  QVar18.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar18);
  QObject::setObjectName((QString *)this_00);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  pQVar3 = (QWidget *)operator_new(0x28);
  QWidget::QWidget(pQVar3,0,0);
  this->loadImageTab = pQVar3;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("loadImageTab",0xd);
  QVar19.m_data = psVar1;
  QVar19.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar19);
  QObject::setObjectName((QString *)pQVar3);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  pQVar4 = (QHBoxLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout(pQVar4,this->loadImageTab);
  this->horizontalLayout_2 = pQVar4;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("horizontalLayout_2",0x13);
  QVar20.m_data = psVar1;
  QVar20.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar20);
  QObject::setObjectName((QString *)pQVar4);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  pQVar5 = (QGroupBox *)operator_new(0x28);
  QGroupBox::QGroupBox(pQVar5,this->loadImageTab);
  this->groupBox = pQVar5;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("groupBox",9);
  QVar21.m_data = psVar1;
  QVar21.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar21);
  QObject::setObjectName((QString *)pQVar5);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  pQVar6 = (QGridLayout *)operator_new(0x20);
  QGridLayout::QGridLayout(pQVar6,(QWidget *)this->groupBox);
  this->gridLayout = pQVar6;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("gridLayout",0xb);
  QVar22.m_data = psVar1;
  QVar22.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar22);
  QObject::setObjectName((QString *)pQVar6);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  pQVar7 = (QLabel *)operator_new(0x28);
  QLabel::QLabel(pQVar7,this->groupBox,0);
  this->targetImageScaleLabel = pQVar7;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("targetImageScaleLabel",0x16);
  QVar23.m_data = psVar1;
  QVar23.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar23);
  QObject::setObjectName((QString *)pQVar7);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QGridLayout::addWidget(this->gridLayout,this->targetImageScaleLabel,3,0,1,1,0);
  pQVar8 = (QTextBrowser *)operator_new(0x28);
  QTextBrowser::QTextBrowser(pQVar8,(QWidget *)this->groupBox);
  this->explanationText = pQVar8;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("explanationText",0x10);
  QVar24.m_data = psVar1;
  QVar24.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar24);
  QObject::setObjectName((QString *)pQVar8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QGridLayout::addWidget(this->gridLayout,this->explanationText,0,0,1,3,0);
  pQVar9 = (QPushButton *)operator_new(0x28);
  QPushButton::QPushButton(pQVar9,(QWidget *)this->groupBox);
  this->targetImageRotate90DegreesButton = pQVar9;
  psVar1 = (storage_type *)
           QByteArrayView::lengthHelperCharArray("targetImageRotate90DegreesButton",0x21);
  QVar25.m_data = psVar1;
  QVar25.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar25);
  QObject::setObjectName((QString *)pQVar9);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QGridLayout::addWidget(this->gridLayout,this->targetImageRotate90DegreesButton,2,2,1,1,0);
  pQVar9 = (QPushButton *)operator_new(0x28);
  QPushButton::QPushButton(pQVar9,(QWidget *)this->groupBox);
  this->targetImageLoadButton = pQVar9;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("targetImageLoadButton",0x16);
  QVar26.m_data = psVar1;
  QVar26.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar26);
  QObject::setObjectName((QString *)pQVar9);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QGridLayout::addWidget(this->gridLayout,this->targetImageLoadButton,1,0,1,3,0);
  pQVar3 = (QWidget *)operator_new(0x28);
  QWidget::QWidget(pQVar3,this->groupBox,0);
  this->widget = pQVar3;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("widget",7);
  QVar27.m_data = psVar1;
  QVar27.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar27);
  QObject::setObjectName((QString *)pQVar3);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  this_01 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(this_01,this->widget);
  this->verticalLayout = this_01;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("verticalLayout",0xf);
  QVar28.m_data = psVar1;
  QVar28.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar28);
  QObject::setObjectName((QString *)this_01);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QLayout::setContentsMargins((int)this->verticalLayout,0,0,0);
  pQVar10 = (QDoubleSpinBox *)operator_new(0x28);
  QDoubleSpinBox::QDoubleSpinBox(pQVar10,this->widget);
  this->targetImageXOffsetSpinBox = pQVar10;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("targetImageXOffsetSpinBox",0x1a);
  QVar29.m_data = psVar1;
  QVar29.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar29);
  QObject::setObjectName((QString *)pQVar10);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QDoubleSpinBox::setMinimum(-4096.0);
  QDoubleSpinBox::setMaximum(4096.0);
  QBoxLayout::addWidget(this->verticalLayout,this->targetImageXOffsetSpinBox,0,0);
  pQVar10 = (QDoubleSpinBox *)operator_new(0x28);
  QDoubleSpinBox::QDoubleSpinBox(pQVar10,this->widget);
  this->targetImageYOffsetSpinBox = pQVar10;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("targetImageYOffsetSpinBox",0x1a);
  QVar30.m_data = psVar1;
  QVar30.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar30);
  QObject::setObjectName((QString *)pQVar10);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QDoubleSpinBox::setMinimum(-4096.0);
  QDoubleSpinBox::setMaximum(4096.0);
  QBoxLayout::addWidget(this->verticalLayout,this->targetImageYOffsetSpinBox,0,0);
  QGridLayout::addWidget(this->gridLayout,this->widget,4,1,2,1,0);
  pQVar10 = (QDoubleSpinBox *)operator_new(0x28);
  QDoubleSpinBox::QDoubleSpinBox(pQVar10,(QWidget *)this->groupBox);
  this->targetImageScaleSpinBox = pQVar10;
  local_38 = MainWindow;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("targetImageScaleSpinBox",0x18);
  QVar31.m_data = psVar1;
  QVar31.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar31);
  QObject::setObjectName((QString *)pQVar10);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QDoubleSpinBox::setDecimals((int)this->targetImageScaleSpinBox);
  QDoubleSpinBox::setMinimum(0.01);
  QDoubleSpinBox::setMaximum(10.0);
  QDoubleSpinBox::setSingleStep(1.0);
  QDoubleSpinBox::setStepType((StepType)this->targetImageScaleSpinBox);
  QDoubleSpinBox::setValue(1.0);
  QGridLayout::addWidget(this->gridLayout,this->targetImageScaleSpinBox,3,1,1,1,0);
  pQVar7 = (QLabel *)operator_new(0x28);
  QLabel::QLabel(pQVar7,this->groupBox,0);
  this->targetImageOffsetLabel = pQVar7;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("targetImageOffsetLabel",0x17);
  QVar32.m_data = psVar1;
  QVar32.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar32);
  QObject::setObjectName((QString *)pQVar7);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QGridLayout::addWidget(this->gridLayout,this->targetImageOffsetLabel,4,0,2,1,0);
  pQVar7 = (QLabel *)operator_new(0x28);
  QLabel::QLabel(pQVar7,this->groupBox,0);
  this->targetImageRotationLabel = pQVar7;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("targetImageRotationLabel",0x19);
  QVar33.m_data = psVar1;
  QVar33.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar33);
  QObject::setObjectName((QString *)pQVar7);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QGridLayout::addWidget(this->gridLayout,this->targetImageRotationLabel,2,0,1,1,0);
  this_02 = (QSlider *)operator_new(0x28);
  QSlider::QSlider(this_02,(QWidget *)this->groupBox);
  this->targetImageRotationSlider = this_02;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("targetImageRotationSlider",0x1a);
  QVar34.m_data = psVar1;
  QVar34.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar34);
  QObject::setObjectName((QString *)this_02);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QWidget::sizePolicy();
  QWidget::setSizePolicy((QSizePolicy)SUB84(this->targetImageRotationSlider,0));
  QAbstractSlider::setMaximum((int)this->targetImageRotationSlider);
  QAbstractSlider::setOrientation((Orientation)this->targetImageRotationSlider);
  QGridLayout::addWidget(this->gridLayout,this->targetImageRotationSlider,2,1,1,1,0);
  pQVar9 = (QPushButton *)operator_new(0x28);
  QPushButton::QPushButton(pQVar9,(QWidget *)this->groupBox);
  this->targetImagePreviewButton = pQVar9;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("targetImagePreviewButton",0x19);
  QVar35.m_data = psVar1;
  QVar35.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar35);
  QObject::setObjectName((QString *)pQVar9);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QGridLayout::addWidget(this->gridLayout,this->targetImagePreviewButton,6,0,1,3,0);
  pQVar9 = (QPushButton *)operator_new(0x28);
  QPushButton::QPushButton(pQVar9,(QWidget *)this->groupBox);
  this->targetImageResetTranslationButton = pQVar9;
  psVar1 = (storage_type *)
           QByteArrayView::lengthHelperCharArray("targetImageResetTranslationButton",0x22);
  QVar36.m_data = psVar1;
  QVar36.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar36);
  QObject::setObjectName((QString *)pQVar9);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QGridLayout::addWidget(this->gridLayout,this->targetImageResetTranslationButton,4,2,2,1,0);
  pQVar9 = (QPushButton *)operator_new(0x28);
  QPushButton::QPushButton(pQVar9,(QWidget *)this->groupBox);
  this->setTargetImageButton = pQVar9;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("setTargetImageButton",0x15);
  QVar37.m_data = psVar1;
  QVar37.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar37);
  QObject::setObjectName((QString *)pQVar9);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QGridLayout::addWidget(this->gridLayout,this->setTargetImageButton,8,0,1,3,0);
  pQVar9 = (QPushButton *)operator_new(0x28);
  QPushButton::QPushButton(pQVar9,(QWidget *)this->groupBox);
  this->moreByTroyDevButton = pQVar9;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("moreByTroyDevButton",0x14);
  QVar38.m_data = psVar1;
  QVar38.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar38);
  QObject::setObjectName((QString *)pQVar9);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QGridLayout::addWidget(this->gridLayout,this->moreByTroyDevButton,10,0,1,3,0);
  pQVar9 = (QPushButton *)operator_new(0x28);
  QPushButton::QPushButton(pQVar9,(QWidget *)this->groupBox);
  this->targetImageFitToAreaButton = pQVar9;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("targetImageFitToAreaButton",0x1b);
  QVar39.m_data = psVar1;
  QVar39.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar39);
  QObject::setObjectName((QString *)pQVar9);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QGridLayout::addWidget(this->gridLayout,this->targetImageFitToAreaButton,3,2,1,1,0);
  pQVar11 = (QSpacerItem *)operator_new(0x28);
  *(code **)pQVar11 = _ITM_deregisterTMCloneTable;
  *(undefined8 *)(pQVar11 + 8) = 0x1400000000;
  *(undefined8 *)(pQVar11 + 0x10) = 0x71000000000028;
  *(undefined4 *)(pQVar11 + 0x18) = 0;
  *(undefined4 *)(pQVar11 + 0x1c) = 0;
  *(undefined4 *)(pQVar11 + 0x20) = 0xffffffff;
  *(undefined4 *)(pQVar11 + 0x24) = 0xffffffff;
  this->targetImageOptionsSpacer = pQVar11;
  QGridLayout::addItem(this->gridLayout,pQVar11,9,0,1,3,0);
  pQVar9 = (QPushButton *)operator_new(0x28);
  QPushButton::QPushButton(pQVar9,(QWidget *)this->groupBox);
  this->targetImageSaveButton = pQVar9;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("targetImageSaveButton",0x16);
  QVar40.m_data = psVar1;
  QVar40.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar40);
  QObject::setObjectName((QString *)pQVar9);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QGridLayout::addWidget(this->gridLayout,this->targetImageSaveButton,7,0,1,3,0);
  QBoxLayout::addWidget(this->horizontalLayout_2,this->groupBox,0,0);
  this_03 = (TargetImageWidget *)operator_new(0x78);
  TargetImageWidget::TargetImageWidget(this_03,this->loadImageTab);
  this->allRgbWidget = this_03;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("allRgbWidget",0xd);
  QVar41.m_data = psVar1;
  QVar41.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar41);
  QObject::setObjectName((QString *)this_03);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QWidget::sizePolicy();
  QWidget::setSizePolicy((QSizePolicy)SUB84(this->allRgbWidget,0));
  QBoxLayout::addWidget(this->horizontalLayout_2,this->allRgbWidget,0,0);
  local_58.d = (Data *)0x0;
  local_58.ptr = (char16_t *)0x0;
  local_58.size = 0;
  QTabWidget::addTab((QWidget *)this->tabWidget,(QString *)this->loadImageTab);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  pQVar3 = (QWidget *)operator_new(0x28);
  QWidget::QWidget(pQVar3,0,0);
  this->allRgbTab = pQVar3;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("allRgbTab",10);
  QVar42.m_data = psVar1;
  QVar42.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar42);
  QObject::setObjectName((QString *)pQVar3);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  pQVar4 = (QHBoxLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout(pQVar4,this->allRgbTab);
  this->horizontalLayout_3 = pQVar4;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("horizontalLayout_3",0x13);
  QVar43.m_data = psVar1;
  QVar43.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar43);
  QObject::setObjectName((QString *)pQVar4);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  pQVar5 = (QGroupBox *)operator_new(0x28);
  QGroupBox::QGroupBox(pQVar5,this->allRgbTab);
  this->allRgbSettingsGroup = pQVar5;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("allRgbSettingsGroup",0x14);
  QVar44.m_data = psVar1;
  QVar44.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar44);
  QObject::setObjectName((QString *)pQVar5);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  pQVar6 = (QGridLayout *)operator_new(0x20);
  QGridLayout::QGridLayout(pQVar6,(QWidget *)this->allRgbSettingsGroup);
  this->gridLayout_2 = pQVar6;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("gridLayout_2",0xd);
  QVar45.m_data = psVar1;
  QVar45.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar45);
  QObject::setObjectName((QString *)pQVar6);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  pQVar7 = (QLabel *)operator_new(0x28);
  QLabel::QLabel(pQVar7,this->allRgbSettingsGroup,0);
  this->allRGBImprovementsValueLabel = pQVar7;
  psVar1 = (storage_type *)
           QByteArrayView::lengthHelperCharArray("allRGBImprovementsValueLabel",0x1d);
  QVar46.m_data = psVar1;
  QVar46.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar46);
  QObject::setObjectName((QString *)pQVar7);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QLabel::setAlignment(this->allRGBImprovementsValueLabel,0x82);
  QGridLayout::addWidget(this->gridLayout_2,this->allRGBImprovementsValueLabel,8,1,1,1,0);
  pQVar8 = (QTextBrowser *)operator_new(0x28);
  QTextBrowser::QTextBrowser(pQVar8,(QWidget *)this->allRgbSettingsGroup);
  this->allRgbSolverDetailsTextBrowser = pQVar8;
  psVar1 = (storage_type *)
           QByteArrayView::lengthHelperCharArray("allRgbSolverDetailsTextBrowser",0x1f);
  QVar47.m_data = psVar1;
  QVar47.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar47);
  QObject::setObjectName((QString *)pQVar8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QGridLayout::addWidget(this->gridLayout_2,this->allRgbSolverDetailsTextBrowser,5,0,1,2,0);
  pQVar9 = (QPushButton *)operator_new(0x28);
  QPushButton::QPushButton(pQVar9,(QWidget *)this->allRgbSettingsGroup);
  this->allRgbStartButton = pQVar9;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("allRgbStartButton",0x12);
  QVar48.m_data = psVar1;
  QVar48.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar48);
  QObject::setObjectName((QString *)pQVar9);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QGridLayout::addWidget(this->gridLayout_2,this->allRgbStartButton,6,0,1,1,0);
  pQVar9 = (QPushButton *)operator_new(0x28);
  QPushButton::QPushButton(pQVar9,(QWidget *)this->allRgbSettingsGroup);
  this->allRgbSaveButton = pQVar9;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("allRgbSaveButton",0x11);
  QVar49.m_data = psVar1;
  QVar49.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar49);
  QObject::setObjectName((QString *)pQVar9);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QGridLayout::addWidget(this->gridLayout_2,this->allRgbSaveButton,10,0,1,2,0);
  pQVar9 = (QPushButton *)operator_new(0x28);
  QPushButton::QPushButton(pQVar9,(QWidget *)this->allRgbSettingsGroup);
  this->allRgbStopButton = pQVar9;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("allRgbStopButton",0x11);
  QVar50.m_data = psVar1;
  QVar50.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar50);
  QObject::setObjectName((QString *)pQVar9);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QGridLayout::addWidget(this->gridLayout_2,this->allRgbStopButton,6,1,1,1,0);
  pQVar7 = (QLabel *)operator_new(0x28);
  QLabel::QLabel(pQVar7,this->allRgbSettingsGroup,0);
  this->ImprovementsLabel = pQVar7;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("ImprovementsLabel",0x12);
  QVar51.m_data = psVar1;
  QVar51.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar51);
  QObject::setObjectName((QString *)pQVar7);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QLabel::setAlignment(this->ImprovementsLabel,0x82);
  QGridLayout::addWidget(this->gridLayout_2,this->ImprovementsLabel,8,0,1,1,0);
  pQVar11 = (QSpacerItem *)operator_new(0x28);
  *(code **)pQVar11 = _ITM_deregisterTMCloneTable;
  *(undefined8 *)(pQVar11 + 8) = 0x1400000000;
  *(undefined8 *)(pQVar11 + 0x10) = 0x71000000000028;
  *(undefined4 *)(pQVar11 + 0x18) = 0;
  *(undefined4 *)(pQVar11 + 0x1c) = 0;
  *(undefined4 *)(pQVar11 + 0x20) = 0xffffffff;
  *(undefined4 *)(pQVar11 + 0x24) = 0xffffffff;
  this->allRgbOptionsSpacer = pQVar11;
  QGridLayout::addItem(this->gridLayout_2,pQVar11,0xb,0,1,2,0);
  pQVar9 = (QPushButton *)operator_new(0x28);
  QPushButton::QPushButton(pQVar9,(QWidget *)this->allRgbSettingsGroup);
  this->allRgbLoadButton = pQVar9;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("allRgbLoadButton",0x11);
  QVar52.m_data = psVar1;
  QVar52.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar52);
  QObject::setObjectName((QString *)pQVar9);
  MainWindow_00 = local_38;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QGridLayout::addWidget(this->gridLayout_2,this->allRgbLoadButton,1,0,1,2,0);
  pQVar9 = (QPushButton *)operator_new(0x28);
  QPushButton::QPushButton(pQVar9,(QWidget *)this->allRgbSettingsGroup);
  this->allRgbResetPixelsButton = pQVar9;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("allRgbResetPixelsButton",0x18);
  QVar53.m_data = psVar1;
  QVar53.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar53);
  QObject::setObjectName((QString *)pQVar9);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QGridLayout::addWidget(this->gridLayout_2,this->allRgbResetPixelsButton,0,0,1,2,0);
  pQVar9 = (QPushButton *)operator_new(0x28);
  QPushButton::QPushButton(pQVar9,(QWidget *)this->allRgbSettingsGroup);
  this->allRgbResetViewButton = pQVar9;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("allRgbResetViewButton",0x16);
  QVar54.m_data = psVar1;
  QVar54.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar54);
  QObject::setObjectName((QString *)pQVar9);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QGridLayout::addWidget(this->gridLayout_2,this->allRgbResetViewButton,2,0,1,2,0);
  pQVar7 = (QLabel *)operator_new(0x28);
  QLabel::QLabel(pQVar7,this->allRgbSettingsGroup,0);
  this->allRgbOverlayLabel = pQVar7;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("allRgbOverlayLabel",0x13);
  QVar55.m_data = psVar1;
  QVar55.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar55);
  QObject::setObjectName((QString *)pQVar7);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QLabel::setAlignment(this->allRgbOverlayLabel,0x82);
  QGridLayout::addWidget(this->gridLayout_2,this->allRgbOverlayLabel,4,0,1,1,0);
  this_04 = (QComboBox *)operator_new(0x28);
  QComboBox::QComboBox(this_04,(QWidget *)this->allRgbSettingsGroup);
  this->allRgbSolverComboBox = this_04;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("allRgbSolverComboBox",0x15);
  QVar56.m_data = psVar1;
  QVar56.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar56);
  QObject::setObjectName((QString *)this_04);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QGridLayout::addWidget(this->gridLayout_2,this->allRgbSolverComboBox,4,1,1,1,0);
  pQVar9 = (QPushButton *)operator_new(0x28);
  QPushButton::QPushButton(pQVar9,(QWidget *)this->allRgbSettingsGroup);
  this->allRgbUpdateTargetButton = pQVar9;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("allRgbUpdateTargetButton",0x19);
  QVar57.m_data = psVar1;
  QVar57.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar57);
  QObject::setObjectName((QString *)pQVar9);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QGridLayout::addWidget(this->gridLayout_2,this->allRgbUpdateTargetButton,3,0,1,2,0);
  pQVar7 = (QLabel *)operator_new(0x28);
  QLabel::QLabel(pQVar7,this->allRgbSettingsGroup,0);
  this->allRGBIterationLabel = pQVar7;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("allRGBIterationLabel",0x15);
  QVar58.m_data = psVar1;
  QVar58.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar58);
  QObject::setObjectName((QString *)pQVar7);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QLabel::setAlignment(this->allRGBIterationLabel,0x82);
  QGridLayout::addWidget(this->gridLayout_2,this->allRGBIterationLabel,7,0,1,1,0);
  pQVar9 = (QPushButton *)operator_new(0x28);
  QPushButton::QPushButton(pQVar9,(QWidget *)this->allRgbSettingsGroup);
  this->allRgbPreviewButton = pQVar9;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("allRgbPreviewButton",0x14);
  QVar59.m_data = psVar1;
  QVar59.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar59);
  QObject::setObjectName((QString *)pQVar9);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QGridLayout::addWidget(this->gridLayout_2,this->allRgbPreviewButton,9,0,1,2,0);
  pQVar7 = (QLabel *)operator_new(0x28);
  QLabel::QLabel(pQVar7,this->allRgbSettingsGroup,0);
  this->allRGBIterationsValueLabel = pQVar7;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("allRGBIterationsValueLabel",0x1b);
  QVar60.m_data = psVar1;
  QVar60.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar60);
  QObject::setObjectName((QString *)pQVar7);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QLabel::setAlignment(this->allRGBIterationsValueLabel,0x82);
  QGridLayout::addWidget(this->gridLayout_2,this->allRGBIterationsValueLabel,7,1,1,1,0);
  QBoxLayout::addWidget(this->horizontalLayout_3,this->allRgbSettingsGroup,0,0);
  this_05 = (AllRgbWidget *)operator_new(0xc0);
  AllRgbWidget::AllRgbWidget(this_05,this->allRgbTab);
  this->allRgbPreviewWidget = this_05;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("allRgbPreviewWidget",0x14);
  QVar61.m_data = psVar1;
  QVar61.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar61);
  QObject::setObjectName((QString *)this_05);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QWidget::sizePolicy();
  QWidget::setSizePolicy((QSizePolicy)SUB84(this->allRgbPreviewWidget,0));
  QBoxLayout::addWidget(this->horizontalLayout_3,this->allRgbPreviewWidget,0,0);
  local_58.d = (Data *)0x0;
  local_58.ptr = (char16_t *)0x0;
  local_58.size = 0;
  QTabWidget::addTab((QWidget *)this->tabWidget,(QString *)this->allRgbTab);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QBoxLayout::addWidget(this->horizontalLayout,this->tabWidget,0,0);
  QMainWindow::setCentralWidget((QWidget *)MainWindow_00);
  retranslateUi(this,MainWindow_00);
  QTabWidget::setCurrentIndex((int)this->tabWidget);
  QMetaObject::connectSlotsByName((QObject *)MainWindow_00);
  return;
}

Assistant:

void setupUi(QMainWindow *MainWindow)
    {
        if (MainWindow->objectName().isEmpty())
            MainWindow->setObjectName(QString::fromUtf8("MainWindow"));
        MainWindow->resize(1202, 792);
        actionNew = new QAction(MainWindow);
        actionNew->setObjectName(QString::fromUtf8("actionNew"));
        actionLoad = new QAction(MainWindow);
        actionLoad->setObjectName(QString::fromUtf8("actionLoad"));
        actionSave = new QAction(MainWindow);
        actionSave->setObjectName(QString::fromUtf8("actionSave"));
        centralwidget = new QWidget(MainWindow);
        centralwidget->setObjectName(QString::fromUtf8("centralwidget"));
        horizontalLayout = new QHBoxLayout(centralwidget);
        horizontalLayout->setObjectName(QString::fromUtf8("horizontalLayout"));
        tabWidget = new QTabWidget(centralwidget);
        tabWidget->setObjectName(QString::fromUtf8("tabWidget"));
        loadImageTab = new QWidget();
        loadImageTab->setObjectName(QString::fromUtf8("loadImageTab"));
        horizontalLayout_2 = new QHBoxLayout(loadImageTab);
        horizontalLayout_2->setObjectName(QString::fromUtf8("horizontalLayout_2"));
        groupBox = new QGroupBox(loadImageTab);
        groupBox->setObjectName(QString::fromUtf8("groupBox"));
        gridLayout = new QGridLayout(groupBox);
        gridLayout->setObjectName(QString::fromUtf8("gridLayout"));
        targetImageScaleLabel = new QLabel(groupBox);
        targetImageScaleLabel->setObjectName(QString::fromUtf8("targetImageScaleLabel"));

        gridLayout->addWidget(targetImageScaleLabel, 3, 0, 1, 1);

        explanationText = new QTextBrowser(groupBox);
        explanationText->setObjectName(QString::fromUtf8("explanationText"));

        gridLayout->addWidget(explanationText, 0, 0, 1, 3);

        targetImageRotate90DegreesButton = new QPushButton(groupBox);
        targetImageRotate90DegreesButton->setObjectName(QString::fromUtf8("targetImageRotate90DegreesButton"));

        gridLayout->addWidget(targetImageRotate90DegreesButton, 2, 2, 1, 1);

        targetImageLoadButton = new QPushButton(groupBox);
        targetImageLoadButton->setObjectName(QString::fromUtf8("targetImageLoadButton"));

        gridLayout->addWidget(targetImageLoadButton, 1, 0, 1, 3);

        widget = new QWidget(groupBox);
        widget->setObjectName(QString::fromUtf8("widget"));
        verticalLayout = new QVBoxLayout(widget);
        verticalLayout->setObjectName(QString::fromUtf8("verticalLayout"));
        verticalLayout->setContentsMargins(0, 0, 0, 0);
        targetImageXOffsetSpinBox = new QDoubleSpinBox(widget);
        targetImageXOffsetSpinBox->setObjectName(QString::fromUtf8("targetImageXOffsetSpinBox"));
        targetImageXOffsetSpinBox->setMinimum(-4096.000000000000000);
        targetImageXOffsetSpinBox->setMaximum(4096.000000000000000);

        verticalLayout->addWidget(targetImageXOffsetSpinBox);

        targetImageYOffsetSpinBox = new QDoubleSpinBox(widget);
        targetImageYOffsetSpinBox->setObjectName(QString::fromUtf8("targetImageYOffsetSpinBox"));
        targetImageYOffsetSpinBox->setMinimum(-4096.000000000000000);
        targetImageYOffsetSpinBox->setMaximum(4096.000000000000000);

        verticalLayout->addWidget(targetImageYOffsetSpinBox);


        gridLayout->addWidget(widget, 4, 1, 2, 1);

        targetImageScaleSpinBox = new QDoubleSpinBox(groupBox);
        targetImageScaleSpinBox->setObjectName(QString::fromUtf8("targetImageScaleSpinBox"));
        targetImageScaleSpinBox->setDecimals(2);
        targetImageScaleSpinBox->setMinimum(0.010000000000000);
        targetImageScaleSpinBox->setMaximum(10.000000000000000);
        targetImageScaleSpinBox->setSingleStep(1.000000000000000);
        targetImageScaleSpinBox->setStepType(QAbstractSpinBox::AdaptiveDecimalStepType);
        targetImageScaleSpinBox->setValue(1.000000000000000);

        gridLayout->addWidget(targetImageScaleSpinBox, 3, 1, 1, 1);

        targetImageOffsetLabel = new QLabel(groupBox);
        targetImageOffsetLabel->setObjectName(QString::fromUtf8("targetImageOffsetLabel"));

        gridLayout->addWidget(targetImageOffsetLabel, 4, 0, 2, 1);

        targetImageRotationLabel = new QLabel(groupBox);
        targetImageRotationLabel->setObjectName(QString::fromUtf8("targetImageRotationLabel"));

        gridLayout->addWidget(targetImageRotationLabel, 2, 0, 1, 1);

        targetImageRotationSlider = new QSlider(groupBox);
        targetImageRotationSlider->setObjectName(QString::fromUtf8("targetImageRotationSlider"));
        QSizePolicy sizePolicy(QSizePolicy::Preferred, QSizePolicy::Fixed);
        sizePolicy.setHorizontalStretch(0);
        sizePolicy.setVerticalStretch(0);
        sizePolicy.setHeightForWidth(targetImageRotationSlider->sizePolicy().hasHeightForWidth());
        targetImageRotationSlider->setSizePolicy(sizePolicy);
        targetImageRotationSlider->setMaximum(359);
        targetImageRotationSlider->setOrientation(Qt::Horizontal);

        gridLayout->addWidget(targetImageRotationSlider, 2, 1, 1, 1);

        targetImagePreviewButton = new QPushButton(groupBox);
        targetImagePreviewButton->setObjectName(QString::fromUtf8("targetImagePreviewButton"));

        gridLayout->addWidget(targetImagePreviewButton, 6, 0, 1, 3);

        targetImageResetTranslationButton = new QPushButton(groupBox);
        targetImageResetTranslationButton->setObjectName(QString::fromUtf8("targetImageResetTranslationButton"));

        gridLayout->addWidget(targetImageResetTranslationButton, 4, 2, 2, 1);

        setTargetImageButton = new QPushButton(groupBox);
        setTargetImageButton->setObjectName(QString::fromUtf8("setTargetImageButton"));

        gridLayout->addWidget(setTargetImageButton, 8, 0, 1, 3);

        moreByTroyDevButton = new QPushButton(groupBox);
        moreByTroyDevButton->setObjectName(QString::fromUtf8("moreByTroyDevButton"));

        gridLayout->addWidget(moreByTroyDevButton, 10, 0, 1, 3);

        targetImageFitToAreaButton = new QPushButton(groupBox);
        targetImageFitToAreaButton->setObjectName(QString::fromUtf8("targetImageFitToAreaButton"));

        gridLayout->addWidget(targetImageFitToAreaButton, 3, 2, 1, 1);

        targetImageOptionsSpacer = new QSpacerItem(20, 40, QSizePolicy::Minimum, QSizePolicy::Expanding);

        gridLayout->addItem(targetImageOptionsSpacer, 9, 0, 1, 3);

        targetImageSaveButton = new QPushButton(groupBox);
        targetImageSaveButton->setObjectName(QString::fromUtf8("targetImageSaveButton"));

        gridLayout->addWidget(targetImageSaveButton, 7, 0, 1, 3);


        horizontalLayout_2->addWidget(groupBox);

        allRgbWidget = new TargetImageWidget(loadImageTab);
        allRgbWidget->setObjectName(QString::fromUtf8("allRgbWidget"));
        QSizePolicy sizePolicy1(QSizePolicy::Expanding, QSizePolicy::Expanding);
        sizePolicy1.setHorizontalStretch(0);
        sizePolicy1.setVerticalStretch(0);
        sizePolicy1.setHeightForWidth(allRgbWidget->sizePolicy().hasHeightForWidth());
        allRgbWidget->setSizePolicy(sizePolicy1);

        horizontalLayout_2->addWidget(allRgbWidget);

        tabWidget->addTab(loadImageTab, QString());
        allRgbTab = new QWidget();
        allRgbTab->setObjectName(QString::fromUtf8("allRgbTab"));
        horizontalLayout_3 = new QHBoxLayout(allRgbTab);
        horizontalLayout_3->setObjectName(QString::fromUtf8("horizontalLayout_3"));
        allRgbSettingsGroup = new QGroupBox(allRgbTab);
        allRgbSettingsGroup->setObjectName(QString::fromUtf8("allRgbSettingsGroup"));
        gridLayout_2 = new QGridLayout(allRgbSettingsGroup);
        gridLayout_2->setObjectName(QString::fromUtf8("gridLayout_2"));
        allRGBImprovementsValueLabel = new QLabel(allRgbSettingsGroup);
        allRGBImprovementsValueLabel->setObjectName(QString::fromUtf8("allRGBImprovementsValueLabel"));
        allRGBImprovementsValueLabel->setAlignment(Qt::AlignRight|Qt::AlignTrailing|Qt::AlignVCenter);

        gridLayout_2->addWidget(allRGBImprovementsValueLabel, 8, 1, 1, 1);

        allRgbSolverDetailsTextBrowser = new QTextBrowser(allRgbSettingsGroup);
        allRgbSolverDetailsTextBrowser->setObjectName(QString::fromUtf8("allRgbSolverDetailsTextBrowser"));

        gridLayout_2->addWidget(allRgbSolverDetailsTextBrowser, 5, 0, 1, 2);

        allRgbStartButton = new QPushButton(allRgbSettingsGroup);
        allRgbStartButton->setObjectName(QString::fromUtf8("allRgbStartButton"));

        gridLayout_2->addWidget(allRgbStartButton, 6, 0, 1, 1);

        allRgbSaveButton = new QPushButton(allRgbSettingsGroup);
        allRgbSaveButton->setObjectName(QString::fromUtf8("allRgbSaveButton"));

        gridLayout_2->addWidget(allRgbSaveButton, 10, 0, 1, 2);

        allRgbStopButton = new QPushButton(allRgbSettingsGroup);
        allRgbStopButton->setObjectName(QString::fromUtf8("allRgbStopButton"));

        gridLayout_2->addWidget(allRgbStopButton, 6, 1, 1, 1);

        ImprovementsLabel = new QLabel(allRgbSettingsGroup);
        ImprovementsLabel->setObjectName(QString::fromUtf8("ImprovementsLabel"));
        ImprovementsLabel->setAlignment(Qt::AlignRight|Qt::AlignTrailing|Qt::AlignVCenter);

        gridLayout_2->addWidget(ImprovementsLabel, 8, 0, 1, 1);

        allRgbOptionsSpacer = new QSpacerItem(20, 40, QSizePolicy::Minimum, QSizePolicy::Expanding);

        gridLayout_2->addItem(allRgbOptionsSpacer, 11, 0, 1, 2);

        allRgbLoadButton = new QPushButton(allRgbSettingsGroup);
        allRgbLoadButton->setObjectName(QString::fromUtf8("allRgbLoadButton"));

        gridLayout_2->addWidget(allRgbLoadButton, 1, 0, 1, 2);

        allRgbResetPixelsButton = new QPushButton(allRgbSettingsGroup);
        allRgbResetPixelsButton->setObjectName(QString::fromUtf8("allRgbResetPixelsButton"));

        gridLayout_2->addWidget(allRgbResetPixelsButton, 0, 0, 1, 2);

        allRgbResetViewButton = new QPushButton(allRgbSettingsGroup);
        allRgbResetViewButton->setObjectName(QString::fromUtf8("allRgbResetViewButton"));

        gridLayout_2->addWidget(allRgbResetViewButton, 2, 0, 1, 2);

        allRgbOverlayLabel = new QLabel(allRgbSettingsGroup);
        allRgbOverlayLabel->setObjectName(QString::fromUtf8("allRgbOverlayLabel"));
        allRgbOverlayLabel->setAlignment(Qt::AlignRight|Qt::AlignTrailing|Qt::AlignVCenter);

        gridLayout_2->addWidget(allRgbOverlayLabel, 4, 0, 1, 1);

        allRgbSolverComboBox = new QComboBox(allRgbSettingsGroup);
        allRgbSolverComboBox->setObjectName(QString::fromUtf8("allRgbSolverComboBox"));

        gridLayout_2->addWidget(allRgbSolverComboBox, 4, 1, 1, 1);

        allRgbUpdateTargetButton = new QPushButton(allRgbSettingsGroup);
        allRgbUpdateTargetButton->setObjectName(QString::fromUtf8("allRgbUpdateTargetButton"));

        gridLayout_2->addWidget(allRgbUpdateTargetButton, 3, 0, 1, 2);

        allRGBIterationLabel = new QLabel(allRgbSettingsGroup);
        allRGBIterationLabel->setObjectName(QString::fromUtf8("allRGBIterationLabel"));
        allRGBIterationLabel->setAlignment(Qt::AlignRight|Qt::AlignTrailing|Qt::AlignVCenter);

        gridLayout_2->addWidget(allRGBIterationLabel, 7, 0, 1, 1);

        allRgbPreviewButton = new QPushButton(allRgbSettingsGroup);
        allRgbPreviewButton->setObjectName(QString::fromUtf8("allRgbPreviewButton"));

        gridLayout_2->addWidget(allRgbPreviewButton, 9, 0, 1, 2);

        allRGBIterationsValueLabel = new QLabel(allRgbSettingsGroup);
        allRGBIterationsValueLabel->setObjectName(QString::fromUtf8("allRGBIterationsValueLabel"));
        allRGBIterationsValueLabel->setAlignment(Qt::AlignRight|Qt::AlignTrailing|Qt::AlignVCenter);

        gridLayout_2->addWidget(allRGBIterationsValueLabel, 7, 1, 1, 1);


        horizontalLayout_3->addWidget(allRgbSettingsGroup);

        allRgbPreviewWidget = new AllRgbWidget(allRgbTab);
        allRgbPreviewWidget->setObjectName(QString::fromUtf8("allRgbPreviewWidget"));
        sizePolicy1.setHeightForWidth(allRgbPreviewWidget->sizePolicy().hasHeightForWidth());
        allRgbPreviewWidget->setSizePolicy(sizePolicy1);

        horizontalLayout_3->addWidget(allRgbPreviewWidget);

        tabWidget->addTab(allRgbTab, QString());

        horizontalLayout->addWidget(tabWidget);

        MainWindow->setCentralWidget(centralwidget);

        retranslateUi(MainWindow);

        tabWidget->setCurrentIndex(0);


        QMetaObject::connectSlotsByName(MainWindow);
    }